

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O0

bool libwebm::CopyAndEscapeStartCodes
               (uint8_t *raw_input,size_t raw_input_length,PacketDataBuffer *packet_buffer)

{
  value_type local_3a;
  value_type local_39;
  PacketDataBuffer *pPStack_38;
  uint8_t byte;
  size_t i;
  PacketDataBuffer *pPStack_28;
  int num_zeros;
  PacketDataBuffer *packet_buffer_local;
  size_t raw_input_length_local;
  uint8_t *raw_input_local;
  
  if (((raw_input == (uint8_t *)0x0) || (raw_input_length == 0)) ||
     (packet_buffer == (PacketDataBuffer *)0x0)) {
    raw_input_local._7_1_ = false;
  }
  else {
    i._4_4_ = 0;
    pPStack_28 = packet_buffer;
    packet_buffer_local = (PacketDataBuffer *)raw_input_length;
    raw_input_length_local = (size_t)raw_input;
    for (pPStack_38 = (PacketDataBuffer *)0x0; pPStack_38 < packet_buffer_local;
        pPStack_38 = (PacketDataBuffer *)
                     ((long)&(pPStack_38->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start + 1)) {
      local_39 = *(value_type *)
                  ((long)&(pPStack_38->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start + raw_input_length_local);
      if (local_39 == '\0') {
        i._4_4_ = i._4_4_ + 1;
      }
      else {
        if ((1 < i._4_4_) && ((local_39 == '\x01' || (local_39 == '\x03')))) {
          local_3a = '\x03';
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (pPStack_28,&local_3a);
        }
        i._4_4_ = 0;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pPStack_28,&local_39);
    }
    raw_input_local._7_1_ = true;
  }
  return raw_input_local._7_1_;
}

Assistant:

bool CopyAndEscapeStartCodes(const std::uint8_t* raw_input,
                             std::size_t raw_input_length,
                             PacketDataBuffer* packet_buffer) {
  if (raw_input == nullptr || raw_input_length < 1 || packet_buffer == nullptr)
    return false;

  int num_zeros = 0;
  for (std::size_t i = 0; i < raw_input_length; ++i) {
    const uint8_t byte = raw_input[i];

    if (byte == 0) {
      ++num_zeros;
    } else if (num_zeros >= 2 && (byte == 0x1 || byte == 0x3)) {
      packet_buffer->push_back(0x3);
      num_zeros = 0;
    } else {
      num_zeros = 0;
    }

    packet_buffer->push_back(byte);
  }

  return true;
}